

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void __thiscall
duckdb::TupleDataCollection::Scatter
          (TupleDataCollection *this,TupleDataChunkState *chunk_state,Vector *source,
          column_t column_id,SelectionVector *append_sel,idx_t append_count)

{
  tuple_data_scatter_function_t p_Var1;
  TupleDataLayout *pTVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  
  pvVar3 = vector<duckdb::TupleDataScatterFunction,_true>::operator[]
                     (&this->scatter_functions,column_id);
  p_Var1 = pvVar3->function;
  pvVar4 = vector<duckdb::TupleDataVectorFormat,_true>::operator[]
                     (&chunk_state->vector_data,column_id);
  pTVar2 = this->layout;
  pvVar5 = vector<duckdb::TupleDataVectorFormat,_true>::operator[]
                     (&chunk_state->vector_data,column_id);
  (*p_Var1)(source,pvVar4,append_sel,append_count,pTVar2,&chunk_state->row_locations,
            &chunk_state->heap_locations,column_id,&pvVar5->unified,&pvVar3->child_functions);
  return;
}

Assistant:

void TupleDataCollection::Scatter(TupleDataChunkState &chunk_state, const Vector &source, const column_t column_id,
                                  const SelectionVector &append_sel, const idx_t append_count) const {
	const auto &scatter_function = scatter_functions[column_id];
	scatter_function.function(source, chunk_state.vector_data[column_id], append_sel, append_count, layout,
	                          chunk_state.row_locations, chunk_state.heap_locations, column_id,
	                          chunk_state.vector_data[column_id].unified, scatter_function.child_functions);
}